

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIOption.h
# Opt level: O2

void __thiscall
libchess::UCIOption<bool>::set_option(UCIOption<bool> *this,value_type_conflict1 *value)

{
  this->value_ = *value;
  std::function<void_(const_bool_&)>::operator()(&this->handler_,value);
  return;
}

Assistant:

virtual void set_option(const value_type& value) noexcept {
        value_ = value;
        handler_(value);
    }